

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O0

string * __thiscall
deqp::gles2::Functional::FboConfig::getName_abi_cxx11_
          (string *__return_storage_ptr__,FboConfig *this)

{
  GLenum GVar1;
  char *pcVar2;
  long lVar3;
  allocator<char> local_1a;
  undefined1 local_19;
  FboConfig *local_18;
  FboConfig *this_local;
  string *name;
  
  local_19 = 0;
  local_18 = this;
  this_local = (FboConfig *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  if (this->colorbufferType != 0) {
    GVar1 = this->colorbufferType;
    if (GVar1 == 0xde1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"tex2d_");
    }
    else if (GVar1 == 0x8513) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"texcube_");
    }
    else if (GVar1 == 0x8d41) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"rbo_");
    }
    pcVar2 = getFormatName(this->colorbufferFormat);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar2);
  }
  if (this->depthbufferType != 0) {
    lVar3 = std::__cxx11::string::length();
    if (lVar3 != 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"_");
    }
    pcVar2 = getFormatName(this->depthbufferFormat);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar2);
  }
  if (this->stencilbufferType != 0) {
    lVar3 = std::__cxx11::string::length();
    if (lVar3 != 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"_");
    }
    pcVar2 = getFormatName(this->stencilbufferFormat);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FboConfig::getName (void) const
{
	std::string name = "";

	if (colorbufferType != GL_NONE)
	{
		switch (colorbufferType)
		{
			case GL_TEXTURE_2D:			name += "tex2d_";	break;
			case GL_TEXTURE_CUBE_MAP:	name += "texcube_";	break;
			case GL_RENDERBUFFER:		name += "rbo_";		break;
			default:					DE_ASSERT(false);	break;
		}
		name += getFormatName(colorbufferFormat);
	}

	if (depthbufferType != GL_NONE)
	{
		DE_ASSERT(depthbufferType == GL_RENDERBUFFER);
		if (name.length() > 0)
			name += "_";
		name += getFormatName(depthbufferFormat);
	}

	if (stencilbufferType != GL_NONE)
	{
		DE_ASSERT(stencilbufferType == GL_RENDERBUFFER);
		if (name.length() > 0)
			name += "_";
		name += getFormatName(stencilbufferFormat);
	}

	return name;
}